

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O2

void __thiscall OStreamTest_Print_Test::TestBody(OStreamTest_Print_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertHelper local_320;
  AssertionResult gtest_ar;
  wostringstream wos;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  fmt::v5::print<char[10],char[6]>
            ((basic_ostream<char,_std::char_traits<char>_> *)&os,(char (*) [10])"Don\'t {}!",
             (char (*) [6])"panic");
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Don\'t panic!\"","os.str()",(char (*) [13])"Don\'t panic!",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wos);
  std::__cxx11::string::~string((string *)&wos);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&wos);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0x6e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&wos);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&wos);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&wos);
  fmt::v5::print<wchar_t[10],wchar_t[6]>
            ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&wos,
             (wchar_t (*) [10])L"Don\'t {}!",(wchar_t (*) [6])L"panic");
  std::__cxx11::wstringbuf::str();
  testing::internal::CmpHelperEQ<wchar_t[13],std::__cxx11::wstring>
            ((internal *)&gtest_ar_1,"L\"Don\'t panic!\"","wos.str()",
             (wchar_t (*) [13])L"Don\'t panic!",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
            );
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0x71,pcVar1);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&wos);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return;
}

Assistant:

TEST(OStreamTest, Print) {
  std::ostringstream os;
  fmt::print(os, "Don't {}!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  std::wostringstream wos;
  fmt::print(wos, L"Don't {}!", L"panic");
  EXPECT_EQ(L"Don't panic!", wos.str());
}